

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::make_loo_norm(quadratic_cost_type<float> *this,int n)

{
  quad *pqVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  float fVar6;
  undefined1 auVar7 [64];
  
  pfVar3 = (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
           _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  pfVar3 = std::__max_element<float*,__gnu_cxx::__ops::_Iter_less_iter>(pfVar3,pfVar3 + n);
  auVar7 = ZEXT464((uint)*pfVar3);
  uVar4 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    auVar2 = vmaxss_avx(auVar7._0_16_,
                        ZEXT416((uint)(this->quadratic_elements)._M_t.
                                      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                                      .
                                      super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>
                                      ._M_head_impl[uVar5].factor));
    auVar7 = ZEXT1664(auVar2);
  }
  fVar6 = auVar7._0_4_;
  if ((int)ABS(fVar6) - 0x800000U < 0x7f000000) {
    pfVar3 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    for (uVar5 = 0; (uint)n != uVar5; uVar5 = uVar5 + 1) {
      pfVar3[uVar5] = pfVar3[uVar5] / fVar6;
    }
    pqVar1 = (this->quadratic_elements)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
             _M_head_impl;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pqVar1[uVar5].factor = pqVar1[uVar5].factor / fVar6;
    }
  }
  return;
}

Assistant:

void make_loo_norm(int n)
    {
        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div = std::max(quadratic_elements[i].factor, div);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }